

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_LongLongIntegerReturnValueSetsDifferentValues_Test::testBody
          (TEST_MockReturnValueTest_LongLongIntegerReturnValueSetsDifferentValues_Test *this)

{
  undefined8 uVar1;
  longlong lVar2;
  int iVar3;
  MockSupport *pMVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *pUVar5;
  undefined4 extraout_var_01;
  cpputest_longlong cVar6;
  TestTerminator *pTVar7;
  undefined4 extraout_var_02;
  SimpleString local_210;
  MockNamedValue local_200;
  SimpleString local_1b0;
  SimpleString local_1a0;
  MockNamedValue local_190;
  SimpleString local_140;
  MockNamedValue local_130;
  SimpleString local_e0;
  SimpleString local_d0;
  MockNamedValue local_c0;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50 [2];
  SimpleString local_30;
  undefined8 local_20;
  longlong another_expected_value;
  longlong expected_value;
  TEST_MockReturnValueTest_LongLongIntegerReturnValueSetsDifferentValues_Test *this_local;
  
  another_expected_value = 1;
  local_20 = 2;
  expected_value = (longlong)this;
  SimpleString::SimpleString(&local_30,"");
  pMVar4 = mock(&local_30,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_50,"foo");
  iVar3 = (*pMVar4->_vptr_MockSupport[3])(pMVar4,local_50);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0xe8))
            ((long *)CONCAT44(extraout_var,iVar3),another_expected_value);
  SimpleString::~SimpleString(local_50);
  SimpleString::~SimpleString(&local_30);
  SimpleString::SimpleString(&local_60,"");
  pMVar4 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_70,"foo");
  iVar3 = (*pMVar4->_vptr_MockSupport[3])(pMVar4,&local_70);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0xe8))
            ((long *)CONCAT44(extraout_var_00,iVar3),local_20);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  pUVar5 = UtestShell::getCurrent();
  lVar2 = another_expected_value;
  SimpleString::SimpleString(&local_d0,"");
  pMVar4 = mock(&local_d0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_e0,"foo");
  iVar3 = (*pMVar4->_vptr_MockSupport[6])(pMVar4,&local_e0);
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0xa8))(&local_c0);
  cVar6 = MockNamedValue::getLongLongIntValue(&local_c0);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0x10])
            (pUVar5,lVar2,cVar6,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x21f,pTVar7);
  MockNamedValue::~MockNamedValue(&local_c0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::~SimpleString(&local_d0);
  pUVar5 = UtestShell::getCurrent();
  lVar2 = another_expected_value;
  SimpleString::SimpleString(&local_140,"");
  pMVar4 = mock(&local_140,(MockFailureReporter *)0x0);
  (*pMVar4->_vptr_MockSupport[8])(&local_130);
  cVar6 = MockNamedValue::getLongLongIntValue(&local_130);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0x10])
            (pUVar5,lVar2,cVar6,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x220,pTVar7);
  MockNamedValue::~MockNamedValue(&local_130);
  SimpleString::~SimpleString(&local_140);
  pUVar5 = UtestShell::getCurrent();
  uVar1 = local_20;
  SimpleString::SimpleString(&local_1a0,"");
  pMVar4 = mock(&local_1a0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_1b0,"foo");
  iVar3 = (*pMVar4->_vptr_MockSupport[6])(pMVar4,&local_1b0);
  (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0xa8))(&local_190);
  cVar6 = MockNamedValue::getLongLongIntValue(&local_190);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0x10])
            (pUVar5,uVar1,cVar6,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x221,pTVar7);
  MockNamedValue::~MockNamedValue(&local_190);
  SimpleString::~SimpleString(&local_1b0);
  SimpleString::~SimpleString(&local_1a0);
  pUVar5 = UtestShell::getCurrent();
  uVar1 = local_20;
  SimpleString::SimpleString(&local_210,"");
  pMVar4 = mock(&local_210,(MockFailureReporter *)0x0);
  (*pMVar4->_vptr_MockSupport[8])(&local_200);
  cVar6 = MockNamedValue::getLongLongIntValue(&local_200);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0x10])
            (pUVar5,uVar1,cVar6,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x222,pTVar7);
  MockNamedValue::~MockNamedValue(&local_200);
  SimpleString::~SimpleString(&local_210);
  return;
}

Assistant:

TEST(MockReturnValueTest, LongLongIntegerReturnValueSetsDifferentValues)
{
    long long int expected_value = 1;
    long long int another_expected_value = 2;

    mock().expectOneCall("foo").andReturnValue(expected_value);
    mock().expectOneCall("foo").andReturnValue(another_expected_value);

    LONGLONGS_EQUAL(expected_value, mock().actualCall("foo").returnValue().getLongLongIntValue());
    LONGLONGS_EQUAL(expected_value, mock().returnValue().getLongLongIntValue());
    LONGLONGS_EQUAL(another_expected_value, mock().actualCall("foo").returnValue().getLongLongIntValue());
    LONGLONGS_EQUAL(another_expected_value, mock().returnValue().getLongLongIntValue());
}